

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

bool __thiscall SQClass::SetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  SQObjectType SVar4;
  SQTable *pSVar5;
  long *plVar6;
  bool bVar7;
  ulong uVar8;
  SQClassMember *pSVar9;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar7 = SQTable::Get(this->_members,key,&local_28);
  if (bVar7) {
    pSVar5 = (val->super_SQObject)._unVal.pTable;
    if ((local_28.super_SQObject._unVal._0_4_ >> 0x19 & 1) == 0) {
      pSVar9 = (this->_methods)._vals;
    }
    else {
      pSVar9 = (this->_defaultvalues)._vals;
    }
    uVar8 = (ulong)((local_28.super_SQObject._unVal._0_4_ & 0xffffff) << 5);
    uVar3 = *(uint *)((long)&(pSVar9->attrs).super_SQObject._type + uVar8);
    plVar6 = *(long **)((long)&(pSVar9->attrs).super_SQObject._unVal + uVar8);
    *(SQTable **)((long)&(pSVar9->attrs).super_SQObject._unVal + uVar8) = pSVar5;
    SVar4 = (val->super_SQObject)._type;
    *(SQObjectType *)((long)&(pSVar9->attrs).super_SQObject._type + uVar8) = SVar4;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((uVar3 >> 0x1b & 1) != 0) {
      plVar2 = plVar6 + 1;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (**(code **)(*plVar6 + 0x10))();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar7;
}

Assistant:

bool SQClass::SetAttributes(const SQObjectPtr &key,const SQObjectPtr &val)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        if(_isfield(idx))
            _defaultvalues[_member_idx(idx)].attrs = val;
        else
            _methods[_member_idx(idx)].attrs = val;
        return true;
    }
    return false;
}